

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  size_t sVar4;
  const_iterator puVar5;
  byte_string_view *in_RSI;
  back_insert_iterator<jsoncons::binary_stream_sink> in_RDI;
  uint8_t c;
  const_iterator __end3;
  const_iterator __begin3;
  byte_string_view *__range3;
  size_t length;
  binary_stream_sink *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff86;
  size_t sVar6;
  size_t sVar7;
  uint val;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  const_iterator local_50;
  
  sVar4 = byte_string_view::size(in_RSI);
  sVar7 = sVar4;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (bVar1 < sVar7) {
    sVar6 = sVar4;
    uVar2 = std::numeric_limits<unsigned_short>::max();
    val = (uint)(sVar7 >> 0x20);
    if (uVar2 < sVar6) {
      in_stack_ffffffffffffff78 = sVar4;
      uVar3 = std::numeric_limits<unsigned_int>::max();
      if (in_stack_ffffffffffffff78 <= uVar3) {
        binary_stream_sink::push_back
                  ((binary_stream_sink *)
                   CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
                   (uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
        in_stack_ffffffffffffff74 = (undefined4)sVar4;
        std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
        d_first.container._7_1_ = in_stack_ffffffffffffffa7;
        d_first.container._0_7_ = in_stack_ffffffffffffffa0;
        binary::
        native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (val,d_first);
      }
    }
    else {
      binary_stream_sink::push_back
                ((binary_stream_sink *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
                 ,(uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
      uVar2 = (unsigned_short)(sVar6 >> 0x30);
      in_stack_ffffffffffffff86 = (undefined2)sVar4;
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff68);
      binary::
      native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (uVar2,in_RDI);
    }
  }
  else {
    binary_stream_sink::push_back
              ((binary_stream_sink *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
               (uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
    binary_stream_sink::push_back
              ((binary_stream_sink *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
               (uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
  }
  local_50 = byte_string_view::begin(in_RSI);
  puVar5 = byte_string_view::end(in_RSI);
  for (; local_50 != puVar5; local_50 = local_50 + 1) {
    binary_stream_sink::push_back
              ((binary_stream_sink *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
               (uint8_t)(in_stack_ffffffffffffff78 >> 0x38));
  }
  end_value((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) final
        {

            const std::size_t length = b.size();
            if (length <= (std::numeric_limits<uint8_t>::max)())
            {
                // bin 8 stores a byte array whose length is upto (2^8)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin8_type);
                sink_.push_back(static_cast<uint8_t>(length));
            }
            else if (length <= (std::numeric_limits<uint16_t>::max)())
            {
                // bin 16 stores a byte array whose length is upto (2^16)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin16_type);
                binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
            }
            else if (length <= (std::numeric_limits<uint32_t>::max)())
            {
                // bin 32 stores a byte array whose length is upto (2^32)-1 bytes
                sink_.push_back(jsoncons::msgpack::msgpack_type::bin32_type);
                binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
            }

            for (auto c : b)
            {
                sink_.push_back(c);
            }

            end_value();
            JSONCONS_VISITOR_RETURN;
        }